

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseAssembler::setOffset(BaseAssembler *this,size_t offset)

{
  ulong uVar1;
  Error EVar2;
  ulong uVar3;
  Error EStack_8;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EStack_8 = 5;
  }
  else {
    uVar1 = (this->_section->_buffer)._size;
    uVar3 = (long)this->_bufferPtr - (long)this->_bufferData;
    if (uVar3 < uVar1) {
      uVar3 = uVar1;
    }
    if (offset <= uVar3) {
      this->_bufferPtr = this->_bufferData + offset;
      return 0;
    }
    EStack_8 = 2;
  }
  EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,EStack_8,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseAssembler::setOffset(size_t offset) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  size_t size = Support::max<size_t>(_section->bufferSize(), this->offset());
  if (ASMJIT_UNLIKELY(offset > size))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  _bufferPtr = _bufferData + offset;
  return kErrorOk;
}